

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS3DLoader.cpp
# Opt level: O1

bool __thiscall
Assimp::MS3DImporter::CanRead(MS3DImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  int iVar2;
  char *tokens [1];
  string extension;
  char *local_48;
  string local_40;
  
  BaseImporter::GetExtension(&local_40,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_40);
  bVar1 = true;
  if (iVar2 != 0) {
    if (local_40._M_string_length == 0 || checkSig) {
      if (pIOHandler != (IOSystem *)0x0) {
        local_48 = "MS3D000000";
        bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_48,1,200,false,false)
        ;
      }
    }
    else {
      bVar1 = false;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool MS3DImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    // first call - simple extension check
    const std::string extension = GetExtension(pFile);
    if (extension == "ms3d") {
        return true;
    }

    // second call - check for magic identifiers
    else if (!extension.length() || checkSig)   {
        if (!pIOHandler) {
            return true;
        }
        const char* tokens[] = {"MS3D000000"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}